

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription_sync_test.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::price::pixie::subscription_sync_test::
SubscriptionSyncTest_test_to_string_with_a_few_controls_and_compressed_Test::TestBody
          (SubscriptionSyncTest_test_to_string_with_a_few_controls_and_compressed_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  SubscriptionSync subscription_sync;
  AssertHelper local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  internal local_98 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  local_88;
  code *local_70 [4];
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>,_std::_Select1st<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>_>
  local_50;
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  local_20;
  
  std::
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  ::vector(&local_88,
           (vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
            *)subject_list);
  bidfx_public_api::price::pixie::SubscriptionSync::SubscriptionSync
            ((SubscriptionSync *)local_70,0x7b,&local_88);
  std::
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  ::~vector(&local_88);
  bidfx_public_api::price::pixie::SubscriptionSync::SetCompressed(SUB81(local_70,0));
  bidfx_public_api::price::pixie::SubscriptionSync::AddControl((uint)local_70,TOGGLE);
  bidfx_public_api::price::pixie::SubscriptionSync::ToString_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[165],std::__cxx11::string>
            (local_98,
             "\"SubscriptionSync(edition=123, compressed=true, controls=1, changed=true, subjects=2) [\\n\" \"  Quantity=2500000,Symbol=EURGBP\\n\" \"  Quantity=5600000,Symbol=USDJPY (REFRESH)\\n\" \"]\""
             ,"subscription_sync.ToString()",
             (char (*) [165])
             "SubscriptionSync(edition=123, compressed=true, controls=1, changed=true, subjects=2) [\n  Quantity=2500000,Symbol=EURGBP\n  Quantity=5600000,Symbol=USDJPY (REFRESH)\n]"
             ,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if (local_98[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_b8);
    if (local_90.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_90.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/subscription_sync_test.cpp"
               ,0x7e,message);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((long *)local_b8._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_b8._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_b8._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_70[0] = bidfx_public_api::price::pixie::WelcomeMessage::operator==;
  std::
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  ::~vector(&local_20);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>,_std::_Select1st<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>_>
  ::~_Rb_tree(&local_50);
  return;
}

Assistant:

TEST(SubscriptionSyncTest, test_to_string_with_a_few_controls_and_compressed)
{
    SubscriptionSync subscription_sync = SubscriptionSync(EDITION, subject_list);

    subscription_sync.SetCompressed(true);
    subscription_sync.AddControl(1, ControlOperationEnum::REFRESH);

    ASSERT_EQ("SubscriptionSync(edition=123, compressed=true, controls=1, changed=true, subjects=2) [\n"
                 "  Quantity=2500000,Symbol=EURGBP\n"
                 "  Quantity=5600000,Symbol=USDJPY (REFRESH)\n"
                 "]", subscription_sync.ToString());
}